

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-file_reading.c
# Opt level: O0

void CGTFS_FileReading(void)

{
  int iVar1;
  greatest_test_res local_40;
  greatest_test_res local_3c;
  greatest_test_res res_13;
  greatest_test_res res_12;
  greatest_test_res res_11;
  greatest_test_res res_10;
  greatest_test_res res_9;
  greatest_test_res res_8;
  greatest_test_res res_7;
  greatest_test_res res_6;
  greatest_test_res res_5;
  greatest_test_res res_4;
  greatest_test_res res_3;
  greatest_test_res res_2;
  greatest_test_res res_1;
  greatest_test_res res;
  
  iVar1 = greatest_test_pre("fr_agency");
  if (iVar1 == 1) {
    res_2 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_2 == GREATEST_TEST_RES_PASS) {
      res_2 = fr_agency();
    }
    greatest_test_post(res_2);
  }
  iVar1 = greatest_test_pre("fr_calendar_dates");
  if (iVar1 == 1) {
    res_3 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_3 == GREATEST_TEST_RES_PASS) {
      res_3 = fr_calendar_dates();
    }
    greatest_test_post(res_3);
  }
  iVar1 = greatest_test_pre("fr_calendar_records");
  if (iVar1 == 1) {
    res_4 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_4 == GREATEST_TEST_RES_PASS) {
      res_4 = fr_calendar_records();
    }
    greatest_test_post(res_4);
  }
  iVar1 = greatest_test_pre("fr_fare_attributes");
  if (iVar1 == 1) {
    res_5 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_5 == GREATEST_TEST_RES_PASS) {
      res_5 = fr_fare_attributes();
    }
    greatest_test_post(res_5);
  }
  iVar1 = greatest_test_pre("fr_fare_rules");
  if (iVar1 == 1) {
    res_6 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_6 == GREATEST_TEST_RES_PASS) {
      res_6 = fr_fare_rules();
    }
    greatest_test_post(res_6);
  }
  iVar1 = greatest_test_pre("fr_frequencies");
  if (iVar1 == 1) {
    res_7 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_7 == GREATEST_TEST_RES_PASS) {
      res_7 = fr_frequencies();
    }
    greatest_test_post(res_7);
  }
  iVar1 = greatest_test_pre("fr_levels");
  if (iVar1 == 1) {
    res_8 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_8 == GREATEST_TEST_RES_PASS) {
      res_8 = fr_levels();
    }
    greatest_test_post(res_8);
  }
  iVar1 = greatest_test_pre("fr_pathways");
  if (iVar1 == 1) {
    res_9 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_9 == GREATEST_TEST_RES_PASS) {
      res_9 = fr_pathways();
    }
    greatest_test_post(res_9);
  }
  iVar1 = greatest_test_pre("fr_routes");
  if (iVar1 == 1) {
    res_10 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_10 == GREATEST_TEST_RES_PASS) {
      res_10 = fr_routes();
    }
    greatest_test_post(res_10);
  }
  iVar1 = greatest_test_pre("fr_shapes");
  if (iVar1 == 1) {
    res_11 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_11 == GREATEST_TEST_RES_PASS) {
      res_11 = fr_shapes();
    }
    greatest_test_post(res_11);
  }
  iVar1 = greatest_test_pre("fr_stop_times");
  if (iVar1 == 1) {
    res_12 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_12 == GREATEST_TEST_RES_PASS) {
      res_12 = fr_stop_times();
    }
    greatest_test_post(res_12);
  }
  iVar1 = greatest_test_pre("fr_stops");
  if (iVar1 == 1) {
    res_13 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (res_13 == GREATEST_TEST_RES_PASS) {
      res_13 = fr_stops();
    }
    greatest_test_post(res_13);
  }
  iVar1 = greatest_test_pre("fr_transfers");
  if (iVar1 == 1) {
    local_3c = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_3c == GREATEST_TEST_RES_PASS) {
      local_3c = fr_transfers();
    }
    greatest_test_post(local_3c);
  }
  iVar1 = greatest_test_pre("fr_trips");
  if (iVar1 == 1) {
    local_40 = _setjmp((__jmp_buf_tag *)greatest_info.jump_dest);
    if (local_40 == GREATEST_TEST_RES_PASS) {
      local_40 = fr_trips();
    }
    greatest_test_post(local_40);
  }
  return;
}

Assistant:

SUITE(CGTFS_FileReading) {
    RUN_TEST(fr_agency);
    RUN_TEST(fr_calendar_dates);
    RUN_TEST(fr_calendar_records);
    RUN_TEST(fr_fare_attributes);
    RUN_TEST(fr_fare_rules);
    RUN_TEST(fr_frequencies);
    RUN_TEST(fr_levels);
    RUN_TEST(fr_pathways);
    RUN_TEST(fr_routes);
    RUN_TEST(fr_shapes);
    RUN_TEST(fr_stop_times);
    RUN_TEST(fr_stops);
    RUN_TEST(fr_transfers);
    RUN_TEST(fr_trips);
}